

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer_test.cc
# Opt level: O3

void __thiscall prometheus::anon_unknown_0::SerializerTest::SetUp(SerializerTest *this)

{
  Counter *this_00;
  Family<prometheus::Counter> family;
  string local_168;
  undefined1 local_148 [8];
  pointer pMStack_140;
  pointer local_138;
  _Base_ptr local_130;
  _Base_ptr local_128;
  size_t local_120;
  string local_118;
  Family<prometheus::Counter> local_f8;
  
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"requests_total","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  local_148 = (undefined1  [8])0x0;
  pMStack_140 = (pointer)0x0;
  local_138 = (pointer)0x0;
  local_120 = 0;
  local_130 = (_Base_ptr)&pMStack_140;
  local_128 = (_Base_ptr)&pMStack_140;
  Family<prometheus::Counter>::Family(&local_f8,&local_168,&local_118,(Labels *)local_148);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  local_138 = (pointer)0x0;
  local_148 = (undefined1  [8])0x0;
  pMStack_140 = (pointer)0x0;
  local_120 = 0;
  local_130 = (_Base_ptr)&pMStack_140;
  local_128 = (_Base_ptr)&pMStack_140;
  this_00 = Family<prometheus::Counter>::Add<>(&local_f8,(Labels *)local_148);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_148);
  Counter::Increment(this_00);
  Family<prometheus::Counter>::Collect
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             &local_168,&local_f8);
  local_138 = (this->collected).
              super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->collected).
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_168.field_2._M_allocated_capacity;
  local_148 = (undefined1  [8])
              (this->collected).
              super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pMStack_140 = (this->collected).
                super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->collected).
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_168._M_dataplus._M_p;
  (this->collected).
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_168._M_string_length;
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             local_148);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             &local_168);
  local_f8.super_Collectable._vptr_Collectable = (_func_int **)&PTR__Family_001b04a0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_f8.constant_labels_._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.help_._M_dataplus._M_p != &local_f8.help_.field_2) {
    operator_delete(local_f8.help_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.name_._M_dataplus._M_p != &local_f8.name_.field_2) {
    operator_delete(local_f8.name_._M_dataplus._M_p);
  }
  std::_Hashtable<$3a295cb0$>::~_Hashtable(&local_f8.metrics_._M_h);
  return;
}

Assistant:

void SetUp() override {
    Family<Counter> family{"requests_total", "", {}};
    auto& counter = family.Add({});
    counter.Increment();

    collected = family.Collect();
  }